

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_val_t * mpcf_escape_new(mpc_val_t *x,char *input,char **output)

{
  long lVar1;
  char *__s;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  char buff [2];
  
  __s = (char *)calloc(1,1);
  do {
    if (*x == '\0') {
      return __s;
    }
    lVar1 = 0;
    do {
      lVar4 = lVar1;
      pcVar5 = output[lVar4];
      if (pcVar5 == (char *)0x0) {
        sVar2 = strlen(__s);
        __s = (char *)realloc(__s,sVar2 + 2);
        buff[0] = *x;
        buff[1] = '\0';
        pcVar5 = buff;
        goto LAB_001b0b91;
      }
      lVar1 = lVar4 + 1;
    } while (*x != input[lVar4]);
    sVar2 = strlen(__s);
    sVar3 = strlen(pcVar5);
    __s = (char *)realloc(__s,sVar2 + sVar3 + 1);
    pcVar5 = output[lVar4];
LAB_001b0b91:
    strcat(__s,pcVar5);
    x = (mpc_val_t *)((long)x + 1);
  } while( true );
}

Assistant:

static mpc_val_t *mpcf_escape_new(mpc_val_t *x, const char *input, const char **output) {

  int i;
  int found;
  char buff[2];
  char *s = x;
  char *y = calloc(1, 1);

  while (*s) {

    i = 0;
    found = 0;

    while (output[i]) {
      if (*s == input[i]) {
        y = realloc(y, strlen(y) + strlen(output[i]) + 1);
        strcat(y, output[i]);
        found = 1;
        break;
      }
      i++;
    }

    if (!found) {
      y = realloc(y, strlen(y) + 2);
      buff[0] = *s; buff[1] = '\0';
      strcat(y, buff);
    }

    s++;
  }


  return y;
}